

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  char cVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiGroupData *pIVar6;
  bool bVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  char cVar10;
  long lVar11;
  ImGuiID IVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImRect local_28;
  ImVec2 local_18;
  
  pIVar8 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar6 = (GImGui->GroupStack).Data;
  lVar11 = (long)(GImGui->GroupStack).Size;
  local_28.Min = pIVar6[lVar11 + -1].BackupCursorPos;
  IVar2 = (pIVar5->DC).CursorMaxPos;
  fVar18 = pIVar6[lVar11 + -1].BackupCursorPos.x;
  fVar19 = pIVar6[lVar11 + -1].BackupCursorPos.y;
  fVar16 = IVar2.x;
  fVar17 = IVar2.y;
  uVar14 = -(uint)(fVar18 <= fVar16);
  uVar15 = -(uint)(fVar19 <= fVar17);
  local_28.Max = (ImVec2)(CONCAT44(~uVar15 & (uint)fVar19,~uVar14 & (uint)fVar18) |
                         CONCAT44((uint)fVar17 & uVar15,(uint)fVar16 & uVar14));
  (pIVar5->DC).CursorPos = local_28.Min;
  fVar18 = pIVar6[lVar11 + -1].BackupCursorMaxPos.x;
  fVar19 = pIVar6[lVar11 + -1].BackupCursorMaxPos.y;
  uVar14 = -(uint)(fVar16 <= fVar18);
  uVar15 = -(uint)(fVar17 <= fVar19);
  (pIVar5->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar15 & (uint)fVar17,~uVar14 & (uint)fVar16) |
               CONCAT44((uint)fVar19 & uVar15,(uint)fVar18 & uVar14));
  (pIVar5->DC).Indent.x = pIVar6[lVar11 + -1].BackupIndent.x;
  (pIVar5->DC).GroupOffset.x = pIVar6[lVar11 + -1].BackupGroupOffset.x;
  (pIVar5->DC).CurrLineSize = pIVar6[lVar11 + -1].BackupCurrLineSize;
  fVar16 = pIVar6[lVar11 + -1].BackupCurrLineTextBaseOffset;
  (pIVar5->DC).CurrLineTextBaseOffset = fVar16;
  if (pIVar8->LogEnabled == true) {
    pIVar8->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar6[lVar11 + -1].EmitItem != true) goto LAB_0011c081;
  fVar17 = (pIVar5->DC).PrevLineTextBaseOffset;
  uVar14 = -(uint)(fVar16 <= fVar17);
  (pIVar5->DC).CurrLineTextBaseOffset = (float)(~uVar14 & (uint)fVar16 | (uint)fVar17 & uVar14);
  local_18.x = local_28.Max.x - local_28.Min.x;
  local_18.y = local_28.Max.y - local_28.Min.y;
  ItemSize(&local_18,-1.0);
  ItemAdd(&local_28,0,(ImRect *)0x0,1);
  IVar4 = pIVar8->ActiveId;
  if (pIVar6[lVar11 + -1].BackupActiveIdIsAlive == IVar4) {
    if (pIVar6[lVar11 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar3 = pIVar8->ActiveIdPreviousFrameIsAlive;
joined_r0x0011c01f:
      if (cVar3 != '\0') {
        IVar12 = pIVar8->ActiveIdPreviousFrame;
        cVar3 = '\x01';
        bVar9 = false;
        goto LAB_0011c013;
      }
    }
    bVar7 = false;
    cVar10 = '\0';
  }
  else {
    bVar13 = pIVar8->ActiveIdIsAlive != IVar4;
    IVar12 = IVar4;
    if (pIVar6[lVar11 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar3 = pIVar8->ActiveIdPreviousFrameIsAlive;
      bVar9 = true;
      if (IVar4 == 0 || bVar13) goto joined_r0x0011c01f;
    }
    else {
      cVar10 = '\0';
      bVar7 = false;
      cVar3 = '\0';
      bVar9 = true;
      if (IVar4 == 0 || bVar13) goto LAB_0011c025;
    }
LAB_0011c013:
    bVar7 = bVar9;
    cVar10 = cVar3;
    (pIVar8->LastItemData).ID = IVar12;
  }
LAB_0011c025:
  (pIVar8->LastItemData).Rect.Min = local_28.Min;
  (pIVar8->LastItemData).Rect.Max = local_28.Max;
  if ((pIVar6[lVar11 + -1].BackupHoveredIdIsAlive == false) && (pIVar8->HoveredId != 0)) {
    pIVar1 = &(pIVar8->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar7) && (pIVar8->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar8->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar14 = (pIVar8->LastItemData).StatusFlags;
  (pIVar8->LastItemData).StatusFlags = uVar14 | 0x20;
  if ((cVar10 != '\0') && (IVar4 != pIVar8->ActiveIdPreviousFrame)) {
    (pIVar8->LastItemData).StatusFlags = uVar14 | 0x60;
  }
LAB_0011c081:
  (pIVar8->GroupStack).Size = (pIVar8->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}